

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O0

bool __thiscall dg::debug::LLVMDG2Dot::dump(LLVMDG2Dot *this,char *new_file,char *dump_func_only)

{
  bool bVar1;
  const_iterator this_00;
  reference graph;
  long in_RDX;
  StringRef *in_RDI;
  undefined1 auVar2 [16];
  StringRef SVar3;
  pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*> *F;
  const_iterator __end2;
  const_iterator __begin2;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *__range2;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *CF;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *in_stack_ffffffffffffff68;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar4;
  StringRef local_78 [2];
  undefined8 local_58;
  char *in_stack_ffffffffffffffb0;
  _Self local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  bool local_1;
  
  local_20 = in_RDX;
  bVar1 = DG2Dot<dg::LLVMNode>::ensureFile
                    ((DG2Dot<dg::LLVMNode> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                     (char *)in_stack_ffffffffffffff70);
  if (bVar1) {
    local_28 = dg::getConstructedFunctions();
    DG2Dot<dg::LLVMNode>::start(in_stack_ffffffffffffff70);
    local_30 = local_28;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
         ::begin(in_stack_ffffffffffffff68);
    this_00 = std::
              map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
              ::end(in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffc0);
      if (!bVar1) break;
      graph = std::
              _Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
              operator*((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                         *)0x18b3d5);
      bVar4 = 0;
      if (local_20 != 0) {
        auVar2 = llvm::Value::getName();
        in_stack_ffffffffffffffb0 = auVar2._8_8_;
        local_58 = auVar2._0_8_;
        llvm::StringRef::StringRef(in_RDI,(char *)CONCAT17(bVar4,in_stack_ffffffffffffff78));
        SVar3.Data._7_1_ = bVar4;
        SVar3.Data._0_7_ = in_stack_ffffffffffffff78;
        SVar3.Length = (size_t)in_RDI;
        bVar1 = llvm::StringRef::equals((StringRef *)in_stack_ffffffffffffff70,SVar3);
        bVar4 = bVar1 ^ 0xff;
      }
      if ((bVar4 & 1) == 0) {
        in_stack_ffffffffffffff70 = (DG2Dot<dg::LLVMNode> *)graph->second;
        SVar3 = (StringRef)llvm::Value::getName();
        local_78[0] = SVar3;
        llvm::StringRef::data(local_78);
        dumpSubgraph((LLVMDG2Dot *)this_00._M_node,(LLVMDependenceGraph *)graph,
                     in_stack_ffffffffffffffb0);
      }
      std::_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
      operator++((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                  *)in_stack_ffffffffffffff70);
    }
    DG2Dot<dg::LLVMNode>::end((DG2Dot<dg::LLVMNode> *)0x18b48e);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool dump(const char *new_file = nullptr,
              const char *dump_func_only = nullptr) override {
        // make sure we have the file opened
        if (!ensureFile(new_file))
            return false;

        const std::map<llvm::Value *, LLVMDependenceGraph *> &CF =
                getConstructedFunctions();

        start();

        for (const auto &F : CF) {
            if (dump_func_only && !F.first->getName().equals(dump_func_only))
                continue;

            dumpSubgraph(F.second, F.first->getName().data());
        }

        end();

        return true;
    }